

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O3

_Bool container_iterator_prev
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,uint16_t *value)

{
  long lVar1;
  uint uVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  ulong uVar7;
  
  iVar4 = (int)CONCAT71(in_register_00000031,typecode);
  if (iVar4 == 3) {
    if (*value == 0) {
      return false;
    }
    uVar3 = *value - 1;
    *value = uVar3;
    lVar1 = *(long *)((long)c + 8);
    iVar4 = it->index;
    if (*(ushort *)(lVar1 + (long)iVar4 * 4) <= uVar3) {
      return true;
    }
    uVar5 = iVar4 - 1;
    it->index = uVar5;
    if (iVar4 < 1) {
      return false;
    }
    uVar5 = (uint)(ushort)(*(short *)(lVar1 + 2 + (ulong)uVar5 * 4) +
                          *(short *)(lVar1 + (ulong)uVar5 * 4));
  }
  else if (iVar4 == 2) {
    iVar4 = it->index;
    uVar5 = iVar4 - 1;
    it->index = uVar5;
    if (iVar4 < 1) {
      return false;
    }
    uVar5 = (uint)*(ushort *)(*(long *)((long)c + 8) + (ulong)uVar5 * 2);
  }
  else {
    iVar4 = it->index;
    uVar5 = iVar4 - 1;
    it->index = uVar5;
    if (iVar4 < 1) {
      return false;
    }
    uVar2 = uVar5 >> 6;
    uVar7 = (ulong)(*(long *)(*(long *)((long)c + 8) + (ulong)uVar2 * 8) << (~(byte)uVar5 & 0x3f))
            >> (~(byte)uVar5 & 0x3f);
    if (uVar7 == 0) {
      uVar6 = (ulong)(uVar5 >> 6);
      do {
        if ((long)uVar6 < 1) {
          return false;
        }
        uVar7 = *(ulong *)(*(long *)((long)c + 8) + -8 + uVar6 * 8);
        uVar6 = uVar6 - 1;
      } while (uVar7 == 0);
      uVar2 = (uint)uVar6;
    }
    lVar1 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar5 = (uVar2 * 0x40 - ((uint)lVar1 ^ 0x3f)) + 0x3f;
    it->index = uVar5;
  }
  *value = (uint16_t)uVar5;
  return true;
}

Assistant:

bool container_iterator_prev(const container_t *c, uint8_t typecode,
                             roaring_container_iterator_t *it,
                             uint16_t *value) {
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            if (--it->index < 0) {
                return false;
            }

            const bitset_container_t *bc = const_CAST_bitset(c);
            int32_t wordindex = it->index / 64;
            uint64_t word =
                bc->words[wordindex] & (UINT64_MAX >> (63 - (it->index % 64)));

            while (word == 0 && --wordindex >= 0) {
                word = bc->words[wordindex];
            }
            if (word == 0) {
                return false;
            }

            it->index = (wordindex * 64) + (63 - roaring_leading_zeroes(word));
            *value = it->index;
            return true;
        }
        case ARRAY_CONTAINER_TYPE: {
            if (--it->index < 0) {
                return false;
            }
            const array_container_t *ac = const_CAST_array(c);
            *value = ac->array[it->index];
            return true;
        }
        case RUN_CONTAINER_TYPE: {
            if (*value == 0) {
                return false;
            }

            const run_container_t *rc = const_CAST_run(c);
            (*value)--;
            if (*value >= rc->runs[it->index].value) {
                return true;
            }

            if (--it->index < 0) {
                return false;
            }

            *value = rc->runs[it->index].value + rc->runs[it->index].length;
            return true;
        }
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}